

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

char * get_remote_username(Conf *conf)

{
  _Bool _Var1;
  char *s;
  char *username;
  Conf *conf_local;
  
  s = conf_get_str(conf,0x39);
  if (*s == '\0') {
    _Var1 = conf_get_bool(conf,0x3a);
    if (_Var1) {
      conf_local = (Conf *)get_username();
    }
    else {
      conf_local = (Conf *)0x0;
    }
  }
  else {
    conf_local = (Conf *)dupstr(s);
  }
  return (char *)conf_local;
}

Assistant:

char *get_remote_username(Conf *conf)
{
    char *username = conf_get_str(conf, CONF_username);
    if (*username) {
        return dupstr(username);
    } else if (conf_get_bool(conf, CONF_username_from_env)) {
        /* Use local username. */
        return get_username();     /* might still be NULL */
    } else {
        return NULL;
    }
}